

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

void re2c::output_if(OutputFile *o,uint32_t ind,bool *readCh,string *compare,uint32_t value)

{
  OutputFile *pOVar1;
  bool *readCh_00;
  string sStack_48;
  
  pOVar1 = OutputFile::wind(o,ind);
  pOVar1 = OutputFile::ws(pOVar1,"if (");
  output_yych_abi_cxx11_(&sStack_48,(re2c *)readCh,readCh_00);
  pOVar1 = OutputFile::wstring(pOVar1,&sStack_48);
  pOVar1 = OutputFile::ws(pOVar1," ");
  pOVar1 = OutputFile::wstring(pOVar1,compare);
  pOVar1 = OutputFile::ws(pOVar1," ");
  pOVar1 = OutputFile::wc_hex(pOVar1,value);
  OutputFile::ws(pOVar1,") ");
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void output_if (OutputFile & o, uint32_t ind, bool & readCh, const std::string & compare, uint32_t value)
{
	o.wind(ind).ws("if (").wstring(output_yych (readCh)).ws(" ").wstring(compare).ws(" ").wc_hex (value).ws(") ");
}